

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,
          Reflection *reflection,FieldDescriptor *field)

{
  undefined1 local_38 [8];
  StringBaseTextGenerator generator;
  
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&generator.output_._M_string_length;
  local_38 = (undefined1  [8])&PTR__StringBaseTextGenerator_003e3318;
  generator.output_._M_dataplus._M_p = (pointer)0x0;
  generator.output_._M_string_length._0_1_ = 0;
  FastFieldValuePrinter::PrintFieldName
            ((FastFieldValuePrinter *)__return_storage_ptr__,(Message *)this,
             (Reflection *)generator.super_BaseTextGenerator._vptr_BaseTextGenerator,field,
             (BaseTextGenerator *)local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&generator);
  anon_unknown_20::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field) const {
  FORWARD_IMPL(PrintFieldName, message, reflection, field);
}